

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O2

CWordWidthHint __thiscall
CTextRender::MakeWord
          (CTextRender *this,CTextCursor *pCursor,char *pText,char *pEnd,int FontSizeIndex,
          float Size,int PixelSize,vec2 ScreenScale)

{
  float fVar1;
  uint uVar2;
  long lVar3;
  float fVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  CGlyph *pLeft;
  CGlyph *pRight;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  CGlyphMap *this_00;
  uint uVar14;
  long in_FS_OFFSET;
  uint uVar15;
  vec2 vVar16;
  float fVar17;
  CWordWidthHint CVar18;
  float local_f8;
  char *pCur;
  CScaledGlyph Scaled;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = pCursor->m_Flags;
  pCur = pText;
  uVar7 = str_utf8_decode(&pCur);
  if ((int)uVar7 < 1) {
    pLeft = (CGlyph *)0x0;
  }
  else {
    uVar15 = uVar7;
    if (uVar7 - 9 < 2) {
      uVar15 = 0x20;
    }
    pLeft = CGlyphMap::GetGlyph(this->m_pGlyphMap,uVar15,FontSizeIndex,(uVar2 & 1) == 0);
  }
  fVar1 = (pCursor->m_Advance).field_0.x;
  local_f8 = fVar1;
  if ((*pText == '\0') || (pEnd < pCur)) {
    uVar15 = 0;
    iVar12 = -1;
  }
  else {
    uVar15 = -(uint)(pCursor->m_MaxWidth < 0.0);
    fVar4 = (float)(~uVar15 & (uint)pCursor->m_MaxWidth | uVar15 & 0x7f800000);
    iVar11 = 0;
    uVar5 = 0;
    while ((iVar12 = (int)pCur - (int)pText, uVar15 = uVar5, uVar7 != 0 && (pCur <= pEnd))) {
      if ((pLeft == (CGlyph *)0x0) || ((int)uVar7 < 0)) {
        iVar12 = -1;
        goto LAB_0012801a;
      }
      this_00 = (CGlyphMap *)&pCur;
      uVar8 = str_utf8_decode((char **)this_00);
      if ((int)uVar8 < 1) {
        pRight = (CGlyph *)0x0;
      }
      else {
        this_00 = this->m_pGlyphMap;
        uVar15 = uVar8;
        if (uVar8 - 9 < 2) {
          uVar15 = 0x20;
        }
        pRight = CGlyphMap::GetGlyph(this_00,uVar15,FontSizeIndex,(uVar2 & 1) == 0);
      }
      vVar16 = CGlyphMap::Kerning(this_00,pLeft,pRight,PixelSize);
      cVar6 = uVar7 != 0x20 && uVar7 - 0xb < 0xfffffffe;
      if (((uVar2 & 8) != 0) &&
         ((0x20 < uVar7 || ((0x100000600U >> ((ulong)uVar7 & 0x3f) & 1) == 0)))) {
        cVar6 = pCursor->m_StartOfLine;
      }
      if ((fVar4 < local_f8 - fVar1) ||
         ((fVar17 = (vVar16.field_0.x * (1.0 / (float)PixelSize) + pLeft->m_AdvanceX) * Size,
          cVar6 != '\0' && (fVar4 < (pCursor->m_Advance).field_0.x + fVar17)))) {
        uVar9 = 0;
        uVar13 = 0x10000000000;
        goto LAB_0012801c;
      }
      if ((uVar2 & 1) == 0) {
        Scaled.m_NumChars = iVar12 - iVar11;
        Scaled.m_Advance = pCursor->m_Advance;
        Scaled.m_Line = pCursor->m_LineCount + -1;
        Scaled.m_TextColor.field_0 =
             (anon_union_4_2_94730227_for_vector4_base<float>_1)this->m_TextR;
        Scaled.m_TextColor.field_1 =
             (anon_union_4_2_947300d3_for_vector4_base<float>_3)this->m_TextG;
        Scaled.m_TextColor.field_2 =
             (anon_union_4_2_94730039_for_vector4_base<float>_5)this->m_TextB;
        Scaled.m_TextColor.field_3 =
             (anon_union_4_2_94730017_for_vector4_base<float>_7)this->m_TextA;
        Scaled.m_SecondaryColor.field_0 =
             (anon_union_4_2_94730227_for_vector4_base<float>_1)this->m_TextSecondaryR;
        Scaled.m_SecondaryColor.field_1 =
             (anon_union_4_2_947300d3_for_vector4_base<float>_3)this->m_TextSecondaryG;
        Scaled.m_SecondaryColor.field_2 =
             (anon_union_4_2_94730039_for_vector4_base<float>_5)this->m_TextSecondaryB;
        Scaled.m_SecondaryColor.field_3 =
             (anon_union_4_2_94730017_for_vector4_base<float>_7)this->m_TextSecondaryA;
        Scaled.m_pGlyph = pLeft;
        Scaled.m_Size = Size;
        array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::add(&pCursor->m_Glyphs,&Scaled);
      }
      fVar17 = fVar17 + (pCursor->m_Advance).field_0.x;
      (pCursor->m_Advance).field_0.x = fVar17;
      uVar15 = uVar5 + 1;
      iVar11 = iVar12;
      if ((uVar7 < 0x21) && ((0x100000600U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
        uVar9 = CONCAT71(0x1000006,uVar7 == 10);
        bVar10 = (byte)uVar2 >> 1 & uVar7 == 10;
        if (bVar10 != 0) {
          uVar15 = uVar5;
        }
        if (((~bVar10 | (byte)uVar2) & 1) == 0) {
          array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::remove_index
                    (&pCursor->m_Glyphs,(pCursor->m_Glyphs).num_elements + -1);
          uVar9 = 1;
          uVar13 = 0;
        }
        else {
          uVar13 = 0;
          uVar5 = uVar15;
        }
        goto LAB_0012801c;
      }
      uVar14 = uVar7 - 0x20;
      pLeft = pRight;
      uVar7 = uVar8;
      local_f8 = fVar17;
      uVar5 = uVar15;
      if (0x216f < uVar14) goto LAB_0012801a;
    }
    iVar12 = iVar12 + -1;
  }
LAB_0012801a:
  uVar9 = 0;
  uVar13 = 0;
  iVar11 = iVar12;
  uVar5 = uVar15;
LAB_0012801c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  CVar18.m_CharCount = iVar11;
  CVar18.m_EffectiveAdvanceX = local_f8;
  CVar18._8_8_ = (ulong)uVar5 | (uVar9 & 0xff) << 0x20 | uVar13;
  return CVar18;
}

Assistant:

CWordWidthHint CTextRender::MakeWord(CTextCursor *pCursor, const char *pText, const char *pEnd, 
								int FontSizeIndex, float Size, int PixelSize, vec2 ScreenScale)
{
	bool Render = !(pCursor->m_Flags & TEXTFLAG_NO_RENDER);
	bool BreakWord = !(pCursor->m_Flags & TEXTFLAG_WORD_WRAP);
	bool AllowNewline = pCursor->m_Flags & TEXTFLAG_ALLOW_NEWLINE;
	CWordWidthHint Hint;
	const char *pCur = pText;
	int NextChr = str_utf8_decode(&pCur);
	CGlyph *pNextGlyph = NULL;
	if(NextChr > 0)
	{
		if(NextChr == '\n' || NextChr == '\t')
			pNextGlyph = m_pGlyphMap->GetGlyph(' ', FontSizeIndex, Render);
		else
			pNextGlyph = m_pGlyphMap->GetGlyph(NextChr, FontSizeIndex, Render);
	}

	float Scale = 1.0f/PixelSize;
	float MaxWidth = pCursor->m_MaxWidth;
	if(MaxWidth < 0)
		MaxWidth = INFINITY;

	float WordStartAdvanceX = pCursor->m_Advance.x;

	Hint.m_CharCount = 0;
	Hint.m_GlyphCount = 0;
	Hint.m_EffectiveAdvanceX = pCursor->m_Advance.x;
	Hint.m_EndsWithNewline = false;
	Hint.m_IsBroken = false;

	if(*pText == '\0' || pCur > pEnd)
	{
		Hint.m_CharCount = -1;
		return Hint;
	}

	while(1)
	{
		int Chr = NextChr;
		CGlyph *pGlyph = pNextGlyph;
		int CharCount = pCur - pText;
		int NumChars = CharCount - Hint.m_CharCount;
		Hint.m_CharCount = CharCount;

		if(Chr == 0 || pCur > pEnd)
		{
			Hint.m_CharCount--;
			break;
		}

		if(!pGlyph || Chr < 0)
		{
			Hint.m_CharCount = -1;
			return Hint;
		}

		NextChr = str_utf8_decode(&pCur);
		pNextGlyph = NULL;
		if(NextChr > 0)
		{
			if(NextChr == '\n' || NextChr == '\t')
				pNextGlyph = m_pGlyphMap->GetGlyph(' ', FontSizeIndex, Render);
			else
				pNextGlyph = m_pGlyphMap->GetGlyph(NextChr, FontSizeIndex, Render);
		}

		vec2 Kerning = m_pGlyphMap->Kerning(pGlyph, pNextGlyph, PixelSize) * Scale;
		float AdvanceX = (pGlyph->m_AdvanceX + Kerning.x) * Size;
	
		bool IsSpace = Chr == '\n' || Chr == '\t' || Chr == ' ';
		bool CanBreak = !IsSpace && (BreakWord || pCursor->m_StartOfLine);
		if(Hint.m_EffectiveAdvanceX - WordStartAdvanceX > MaxWidth || (CanBreak && pCursor->m_Advance.x + AdvanceX > MaxWidth))
		{
			Hint.m_CharCount -= NumChars;
			Hint.m_IsBroken = true;
			break;
		}

		if(Render)
		{
			CScaledGlyph Scaled;
			Scaled.m_pGlyph = pGlyph;
			Scaled.m_Advance = pCursor->m_Advance;
			Scaled.m_Size = Size;
			Scaled.m_Line = pCursor->m_LineCount - 1;
			Scaled.m_TextColor = vec4(m_TextR, m_TextG, m_TextB, m_TextA);
			Scaled.m_SecondaryColor = vec4(m_TextSecondaryR, m_TextSecondaryG, m_TextSecondaryB, m_TextSecondaryA);
			Scaled.m_NumChars = NumChars;
			pCursor->m_Glyphs.add(Scaled);
		}
		
		pCursor->m_Advance.x += AdvanceX;
		Hint.m_GlyphCount++;

		if(IsSpace || Chr == 0)
		{
			Hint.m_EndsWithNewline = Chr == '\n';
			if(AllowNewline && Hint.m_EndsWithNewline)
			{
				// remove redundant space
				Hint.m_GlyphCount--;
				if(Render)
					pCursor->m_Glyphs.remove_index(pCursor->m_Glyphs.size()-1);
			}
			break;
		}

		Hint.m_EffectiveAdvanceX = pCursor->m_Advance.x;

		// break every char on non latin/greek characters
		if(!isWestern(Chr))
			break;
	}

	return Hint;
}